

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O2

void spell_icy_carapace(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  short sVar1;
  OBJ_DATA *pOVar2;
  bool bVar3;
  OBJ_DATA **ppOVar4;
  bool bVar5;
  char *pcVar6;
  AFFECT_DATA af;
  
  bVar3 = is_affected(ch,(int)gsn_icy_carapace);
  if (bVar3) {
    pcVar6 = "You are already protected by an icy carapace.\n\r";
LAB_00361285:
    send_to_char(pcVar6,ch);
    return;
  }
  sVar1 = ch->in_room->sector_type;
  if ((sVar1 == 6) || (sVar1 == 8)) {
    act("A shell of water flows up around you and solidifies into an icy carapace.",ch,(void *)0x0,
        (void *)0x0,3);
    pcVar6 = "A shell of water flows up around $n and solidifies into an icy carapace.";
  }
  else {
    bVar5 = false;
    bVar3 = false;
    ppOVar4 = &ch->in_room->contents;
    while (pOVar2 = *ppOVar4, pOVar2 != (OBJ_DATA *)0x0) {
      if (pOVar2->item_type == 0x19) {
        bVar3 = true;
      }
      if (pOVar2->pIndexData->vnum == 0xb78) {
        bVar5 = true;
      }
      ppOVar4 = &pOVar2->next_content;
    }
    if (bVar5) {
      if (!bVar3) {
        act("Water flows up from the puddle on the ground, forming an icy carapace around you.",ch,
            (void *)0x0,(void *)0x0,3);
        pcVar6 = "Water flows up from the puddle on the ground, solidifying as ice around $n.";
        goto LAB_003612d1;
      }
    }
    else if (!bVar3) {
      pcVar6 = "There is not enough water here to form an icy carapace.\n\r";
      goto LAB_00361285;
    }
    act("Water flows up from $p, forming an icy carapace around you.",ch,(void *)0x0,(void *)0x0,3);
    pcVar6 = "Water flows up from $p, solidifying as ice around $n.";
  }
LAB_003612d1:
  act(pcVar6,ch,(void *)0x0,(void *)0x0,0);
  init_affect(&af);
  af.where = 0;
  af.aftype = 0;
  af.type = gsn_icy_carapace;
  af.duration = (short)(int)((float)level * 0.7);
  af.modifier = (short)(int)((float)level * 0.82);
  af.location = 0x11;
  af.owner = ch;
  af.level = (short)level;
  affect_to_char(ch,&af);
  af.location = 2;
  af.modifier = -3;
  affect_to_char(ch,&af);
  af.aftype = 5;
  af._34_4_ = af._34_4_ & 0xffff0000;
  af.where = 3;
  af.mod_name = 0xc;
  af.bitvector[0]._1_1_ = af.bitvector[0]._1_1_ | 1;
  affect_to_char(ch,&af);
  return;
}

Assistant:

void spell_icy_carapace(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	OBJ_DATA *obj = nullptr;
	AFFECT_DATA af;
	bool puddle = false, fountain = false;

	if (is_affected(ch, gsn_icy_carapace))
	{
		send_to_char("You are already protected by an icy carapace.\n\r", ch);
		return;
	}

	if (ch->in_room->sector_type != SECT_WATER && ch->in_room->sector_type != SECT_UNDERWATER)
	{
		for (obj = ch->in_room->contents; obj; obj = obj->next_content)
		{
			if (obj->item_type == ITEM_FOUNTAIN)
				fountain = true;

			if (obj->pIndexData->vnum == OBJ_VNUM_PUDDLE)
				puddle = true;
		}

		if (!puddle && !fountain)
		{
			send_to_char("There is not enough water here to form an icy carapace.\n\r", ch);
			return;
		}
	}

	if (fountain)
	{
		act("Water flows up from $p, forming an icy carapace around you.", ch, obj, 0, TO_CHAR);
		act("Water flows up from $p, solidifying as ice around $n.", ch, obj, 0, TO_ROOM);
	}
	else if (puddle)
	{
		act("Water flows up from the puddle on the ground, forming an icy carapace around you.", ch, 0, 0, TO_CHAR);
		act("Water flows up from the puddle on the ground, solidifying as ice around $n.", ch, 0, 0, TO_ROOM);

		if (obj)
			extract_obj(obj);
	}
	else
	{
		act("A shell of water flows up around you and solidifies into an icy carapace.", ch, 0, 0, TO_CHAR);
		act("A shell of water flows up around $n and solidifies into an icy carapace.", ch, 0, 0, TO_ROOM);
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_SPELL;
	af.type = gsn_icy_carapace;
	af.location = APPLY_AC;
	af.level = level;
	af.duration = (int)((float)level * 0.7);
	af.modifier = (int)((float)level * 0.82);
	af.owner = ch;
	affect_to_char(ch, &af);

	af.location = APPLY_DEX;
	af.modifier = -3;
	affect_to_char(ch, &af);

	af.aftype = AFT_INVIS;
	af.location = 0;
	af.where = TO_RESIST;
	af.mod_name = MOD_RESISTANCE;
	SET_BIT(af.bitvector, RES_COLD);
	affect_to_char(ch, &af);
}